

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_attributes.c
# Opt level: O1

void CGTFS_RecordFareAttributes(void)

{
  int iVar1;
  fare_attributes_t a;
  char *field_values [7];
  char *field_names [7];
  fare_attributes_t fStack_208;
  undefined1 local_168 [16];
  char *local_158;
  char *pcStack_150;
  char *local_148;
  char *pcStack_140;
  char *local_138;
  undefined1 local_c8 [16];
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  
  iVar1 = greatest_test_pre("fare_attributes_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_98 = "transfer_duration";
      local_a8 = "transfers";
      pcStack_a0 = "agency_id";
      local_b8 = "currency_type";
      pcStack_b0 = "payment_method";
      local_c8._0_8_ = "fare_id";
      local_c8._8_8_ = "price";
      local_138 = "6000";
      local_148 = "";
      pcStack_140 = "1";
      local_158 = "EUR";
      pcStack_150 = "0";
      local_168._0_8_ = "17";
      local_168._8_8_ = "2.85";
      read_fare_attributes(&fStack_208,7,(char **)local_c8,(char **)local_168);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("17",&fStack_208,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x15;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_001206e8:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"17\" != fa_1.fare_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("EUR",fStack_208.currency_type,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x16;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001206e8;
          greatest_info.msg = "\"EUR\" != fa_1.currency_type";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("1",fStack_208.agency_id,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x17;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001206e8;
            greatest_info.msg = "\"1\" != fa_1.agency_id";
          }
          else if ((fStack_208.price != 2.85) || (NAN(fStack_208.price))) {
            greatest_info.fail_line = 0x18;
            greatest_info.msg = "2.85 != fa_1.price";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
          else if (fStack_208.payment_method == PM_ON_BOARD) {
            if (fStack_208.transfers == TS_UNLIMITED) {
              greatest_info.assertions = greatest_info.assertions + 4;
              if ((fStack_208.transfer_duration == 6000.0) && (!NAN(fStack_208.transfer_duration)))
              {
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0012070a;
              }
              greatest_info.fail_line = 0x1b;
              greatest_info.msg = "6000.0 != fa_1.transfer_duration";
            }
            else {
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "TS_UNLIMITED != fa_1.transfers";
              greatest_info.assertions = greatest_info.assertions + 3;
            }
          }
          else {
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "PM_ON_BOARD != fa_1.payment_method";
            greatest_info.assertions = greatest_info.assertions + 2;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00120935;
    }
LAB_0012070a:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fare_attributes_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&fStack_208,"SOME_ID1",0xa0);
    memcpy((fare_attributes_t *)local_c8,"SOME_ID1",0xa0);
    memcpy(local_168,"SOME_ID1",0xa0);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_fare_attributes(&fStack_208,(fare_attributes_t *)local_c8);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_fare_attributes(&fStack_208,(fare_attributes_t *)local_168);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_fare_attributes((fare_attributes_t *)local_c8,(fare_attributes_t *)local_168);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0012080f;
        }
        greatest_info.fail_line = 0x3f;
        greatest_info.msg = "0 != equal_fare_attributes(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x3e;
        greatest_info.msg = "0 != equal_fare_attributes(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x3d;
      greatest_info.msg = "1 != equal_fare_attributes(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00120935:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
      ;
      abort();
    }
  }
LAB_0012080f:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFareAttributes) {
    RUN_TEST(fare_attributes_read);
    RUN_TEST(fare_attributes_compare);
}